

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O2

float operator~(vec_3d *a)

{
  float fVar1;
  
  fVar1 = operator*(a,a);
  if (0.0 <= fVar1) {
    return SQRT(fVar1);
  }
  fVar1 = sqrtf(fVar1);
  return fVar1;
}

Assistant:

float operator~(const vec_3d &a) {
    float result = a * a;
#ifdef LIBQUAT_ARM
    arm_sqrt_f32(&result, result);
#else
    result = sqrtf(result);
#endif

    return result;
}